

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O3

void jinit_huff_decoder(j_decompress_ptr cinfo)

{
  JHUFF_TBL **htblptr;
  jpeg_entropy_decoder *pjVar1;
  JHUFF_TBL **htblptr_00;
  
  htblptr = (JHUFF_TBL **)&cinfo->enable_external_quant;
  htblptr_00 = (JHUFF_TBL **)&cinfo->colormap;
  if (cinfo->is_decompressor != 0) {
    htblptr_00 = cinfo->ac_huff_tbl_ptrs;
    htblptr = cinfo->dc_huff_tbl_ptrs;
  }
  add_huff_table((j_common_ptr)cinfo,htblptr,std_huff_tables_bits_dc_luminance,
                 std_huff_tables_val_dc_luminance);
  add_huff_table((j_common_ptr)cinfo,htblptr_00,std_huff_tables_bits_ac_luminance,
                 std_huff_tables_val_ac_luminance);
  add_huff_table((j_common_ptr)cinfo,htblptr + 1,std_huff_tables_bits_dc_chrominance,
                 std_huff_tables_val_dc_chrominance);
  add_huff_table((j_common_ptr)cinfo,htblptr_00 + 1,std_huff_tables_bits_ac_chrominance,
                 std_huff_tables_val_ac_chrominance);
  pjVar1 = (jpeg_entropy_decoder *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x170);
  cinfo->entropy = pjVar1;
  pjVar1->start_pass = start_pass_huff_decoder;
  pjVar1->decode_mcu = decode_mcu;
  pjVar1[3].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
  *(undefined8 *)&pjVar1[3].insufficient_data = 0;
  *(undefined8 *)&pjVar1[2].insufficient_data = 0;
  pjVar1[3].start_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar1[4].start_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar1[4].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
  *(undefined8 *)&pjVar1[4].insufficient_data = 0;
  pjVar1[5].start_pass = (_func_void_j_decompress_ptr *)0x0;
  return;
}

Assistant:

GLOBAL(void)
jinit_huff_decoder(j_decompress_ptr cinfo)
{
  huff_entropy_ptr entropy;
  int i;

  /* Motion JPEG frames typically do not include the Huffman tables if they
     are the default tables.  Thus, if the tables are not set by the time
     the Huffman decoder is initialized (usually within the body of
     jpeg_start_decompress()), we set them to default values. */
  std_huff_tables((j_common_ptr)cinfo);

  entropy = (huff_entropy_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(huff_entropy_decoder));
  cinfo->entropy = (struct jpeg_entropy_decoder *)entropy;
  entropy->pub.start_pass = start_pass_huff_decoder;
  entropy->pub.decode_mcu = decode_mcu;

  /* Mark tables unallocated */
  for (i = 0; i < NUM_HUFF_TBLS; i++) {
    entropy->dc_derived_tbls[i] = entropy->ac_derived_tbls[i] = NULL;
  }
}